

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBezierCurve.cpp
# Opt level: O1

void __thiscall
chrono::ChBezierCurveTracker::reset(ChBezierCurveTracker *this,ChVector<double> *loc)

{
  long lVar1;
  size_t sVar2;
  double dVar3;
  pointer __first;
  pointer __last;
  long *plVar4;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  vector<chrono::PointSpec,_std::allocator<chrono::PointSpec>_> points;
  vector<chrono::PointSpec,_std::allocator<chrono::PointSpec>_> local_58;
  PointSpec local_40;
  
  local_58.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>._M_impl.
  super__Vector_impl_data._M_start = (PointSpec *)0x0;
  local_58.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>._M_impl.
  super__Vector_impl_data._M_finish = (PointSpec *)0x0;
  local_58.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (PointSpec *)0x0;
  plVar4 = *(long **)this;
  if (plVar4[1] != *plVar4) {
    lVar5 = 0x10;
    uVar6 = 0;
    do {
      lVar1 = *plVar4;
      dVar3 = loc->m_data[1] - *(double *)(lVar1 + -8 + lVar5);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = loc->m_data[0] - *(double *)(lVar1 + -0x10 + lVar5);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = dVar3 * dVar3;
      auVar7 = vfmadd231sd_fma(auVar10,auVar7,auVar7);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = loc->m_data[2] - *(double *)(lVar1 + lVar5);
      auVar7 = vfmadd231sd_fma(auVar7,auVar12,auVar12);
      local_40.m_dist2 = auVar7._0_8_;
      local_40.m_index = uVar6;
      if (local_58.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>._M_impl
          .super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>::
        _M_realloc_insert<chrono::PointSpec>
                  (&local_58,
                   (iterator)
                   local_58.
                   super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>._M_impl
                   .super__Vector_impl_data._M_finish,&local_40);
      }
      else {
        (local_58.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>._M_impl.
         super__Vector_impl_data._M_finish)->m_index = uVar6;
        (local_58.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>._M_impl.
         super__Vector_impl_data._M_finish)->m_dist2 = local_40.m_dist2;
        local_58.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_58.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      uVar6 = uVar6 + 1;
      plVar4 = *(long **)this;
      lVar5 = lVar5 + 0x18;
    } while (uVar6 < (ulong)((plVar4[1] - *plVar4 >> 3) * -0x5555555555555555));
  }
  __last = local_58.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  __first = local_58.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_58.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_58.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<chrono::PointSpec*,std::vector<chrono::PointSpec,std::allocator<chrono::PointSpec>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(chrono::PointSpec_const&,chrono::PointSpec_const&)>>
              ((__normal_iterator<chrono::PointSpec_*,_std::vector<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>_>
                )local_58.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<chrono::PointSpec_*,_std::vector<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>_>
                )local_58.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
               (ulong)(uint)((int)LZCOUNT((long)local_58.
                                                super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_58.
                                                super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 4) * 2)
               ^ 0x7e,(_Iter_comp_iter<bool_(*)(const_chrono::PointSpec_&,_const_chrono::PointSpec_&)>
                       )0x4f8c4a);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<chrono::PointSpec*,std::vector<chrono::PointSpec,std::allocator<chrono::PointSpec>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(chrono::PointSpec_const&,chrono::PointSpec_const&)>>
              ((__normal_iterator<chrono::PointSpec_*,_std::vector<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>_>
                )__first,
               (__normal_iterator<chrono::PointSpec_*,_std::vector<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>_>
                )__last,(_Iter_comp_iter<bool_(*)(const_chrono::PointSpec_&,_const_chrono::PointSpec_&)>
                         )0x4f8c4a);
  }
  *(undefined8 *)(this + 0x18) = 0x3fe0000000000000;
  sVar2 = (local_58.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>.
           _M_impl.super__Vector_impl_data._M_start)->m_index;
  *(size_t *)(this + 0x10) = sVar2;
  if (sVar2 != 0) {
    lVar5 = **(long **)this;
    if (sVar2 != ((*(long **)this)[1] - lVar5 >> 3) * -0x5555555555555555 - 1U) {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(double *)(lVar5 + sVar2 * 0x18) - loc->m_data[0];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *(double *)(lVar5 + -0x18 + sVar2 * 0x18) - loc->m_data[0];
      auVar13._8_8_ = 0;
      auVar13._0_8_ =
           (*(double *)(lVar5 + 8 + sVar2 * 0x18) - loc->m_data[1]) *
           (*(double *)(lVar5 + -0x10 + sVar2 * 0x18) - loc->m_data[1]);
      auVar7 = vfmadd231sd_fma(auVar13,auVar8,auVar11);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(double *)(lVar5 + -8 + sVar2 * 0x18) - loc->m_data[2];
      auVar14._8_8_ = 0;
      auVar14._0_8_ = *(double *)(lVar5 + 0x10 + sVar2 * 0x18) - loc->m_data[2];
      auVar7 = vfmadd213sd_fma(auVar9,auVar14,auVar7);
      if (0.0 <= auVar7._0_8_) goto LAB_004f8c0b;
    }
    *(size_t *)(this + 0x10) = sVar2 - 1;
  }
LAB_004f8c0b:
  operator_delete(local_58.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (long)local_58.
                        super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_58.
                        super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void ChBezierCurveTracker::reset(const ChVector<>& loc) {
    // Walk all curve points and calculate the distance to the specified reset
    // location, then sort them in increasing order.
    std::vector<PointSpec> points;

    for (size_t i = 0; i < m_path->getNumPoints(); i++)
        points.push_back(PointSpec(i, (loc - m_path->m_points[i]).Length2()));

    std::sort(points.begin(), points.end(), comparePoints);

    // Set the initial guess to be at t=0.5 in either the interval starting at
    // the point with minimum distance or in the previous interval.
    m_curParam = 0.5f;
    m_curInterval = points[0].m_index;

    if (m_curInterval == 0)
        return;

    if (m_curInterval == m_path->getNumPoints() - 1) {
        m_curInterval--;
        return;
    }

    ChVector<> loc2cur = m_path->m_points[m_curInterval] - loc;
    ChVector<> loc2prev = m_path->m_points[m_curInterval - 1] - loc;

    if (Vdot(loc2cur, loc2prev) < 0)
        m_curInterval--;
}